

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_ecma_262_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
          (match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          cur,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              end,back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  out)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  while (cur._M_current != end._M_current) {
    local_38._M_current = cur._M_current + 1;
    if (*cur._M_current == '$') {
      out = format_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
                      (this,&local_38,end,out);
      cur._M_current = local_38._M_current;
    }
    else {
      local_30.container = out.container;
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(&local_30,cur._M_current);
      cur._M_current = local_38._M_current;
    }
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIterator format_ecma_262_(ForwardIterator cur, ForwardIterator end, OutputIterator out) const
    {
        while(cur != end)
        {
            switch(*cur)
            {
            case BOOST_XPR_CHAR_(char_type, '$'):
                out = this->format_backref_(++cur, end, out);
                break;

            default:
                *out++ = *cur++;
                break;
            }
        }

        return out;
    }